

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFCompileUnit.cpp
# Opt level: O2

void __thiscall
llvm::DWARFCompileUnit::dump(DWARFCompileUnit *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  raw_ostream *prVar1;
  DWARFAbbreviationDeclarationSet *pDVar2;
  unsigned_long *puVar3;
  StringRef Str;
  Optional<unsigned_long> OVar4;
  format_object_base local_78;
  uint16_t local_68;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  char *local_58;
  uint64_t local_50;
  undefined1 local_48 [8];
  DWARFDie CUDie;
  
  CUDie.Die = (DWARFDebugInfoEntry *)(this->super_DWARFUnit).Header.Offset;
  CUDie.U = (DWARFUnit *)(DWARFDebugInfoEntry *)0xe7a082;
  local_48 = (undefined1  [8])&PTR_home_01127cf0;
  prVar1 = raw_ostream::operator<<(OS,(format_object_base *)local_48);
  prVar1 = raw_ostream::operator<<(prVar1,": Compile Unit:");
  prVar1 = raw_ostream::operator<<(prVar1," length = ");
  local_50 = (this->super_DWARFUnit).Header.Length;
  local_58 = "0x%08lx";
  local_60.value = (unsigned_long)&PTR_home_01127cf0;
  prVar1 = raw_ostream::operator<<(prVar1,(format_object_base *)&local_60);
  prVar1 = raw_ostream::operator<<(prVar1," version = ");
  local_68 = (this->super_DWARFUnit).Header.FormParams.Version;
  local_78.Fmt = "0x%04x";
  local_78._vptr_format_object_base = (_func_int **)&PTR_home_01127df8;
  raw_ostream::operator<<(prVar1,&local_78);
  if (4 < (this->super_DWARFUnit).Header.FormParams.Version) {
    prVar1 = raw_ostream::operator<<(OS," unit_type = ");
    Str = dwarf::UnitTypeString((uint)(this->super_DWARFUnit).Header.UnitType);
    raw_ostream::operator<<(prVar1,Str);
  }
  pDVar2 = DWARFUnit::getAbbreviations(&this->super_DWARFUnit);
  if (pDVar2 != (DWARFAbbreviationDeclarationSet *)0x0) {
    prVar1 = raw_ostream::operator<<(OS," abbr_offset = ");
    CUDie.Die = (DWARFDebugInfoEntry *)pDVar2->Offset;
    CUDie.U = (DWARFUnit *)"0x%04lx";
    local_48 = (undefined1  [8])&PTR_home_01127cf0;
    raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  }
  prVar1 = raw_ostream::operator<<(OS," addr_size = ");
  CUDie.U = (DWARFUnit *)(DWARFDebugInfoEntry *)0xe83ef2;
  local_48 = (undefined1  [8])&PTR_home_01127e18;
  CUDie.Die = (DWARFDebugInfoEntry *)
              CONCAT71(CUDie.Die._1_7_,(this->super_DWARFUnit).Header.FormParams.AddrSize);
  raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  if ((4 < (this->super_DWARFUnit).Header.FormParams.Version) &&
     ((this->super_DWARFUnit).Header.UnitType != '\x01')) {
    prVar1 = raw_ostream::operator<<(OS," DWO_id = ");
    OVar4 = DWARFUnit::getDWOId(&this->super_DWARFUnit);
    local_60 = OVar4.Storage.field_0;
    local_58 = (char *)CONCAT71(local_58._1_7_,OVar4.Storage.hasVal);
    puVar3 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_60);
    CUDie.U = (DWARFUnit *)"0x%016lx";
    local_48 = (undefined1  [8])&PTR_home_01127cf0;
    CUDie.Die = (DWARFDebugInfoEntry *)*puVar3;
    raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  }
  prVar1 = raw_ostream::operator<<(OS," (next unit at ");
  CUDie.Die = (DWARFDebugInfoEntry *)
              DWARFUnitHeader::getNextUnitOffset(&(this->super_DWARFUnit).Header);
  CUDie.U = (DWARFUnit *)(DWARFDebugInfoEntry *)0xe7a082;
  local_48 = (undefined1  [8])&PTR_home_01127cf0;
  prVar1 = raw_ostream::operator<<(prVar1,(format_object_base *)local_48);
  raw_ostream::operator<<(prVar1,")\n");
  _local_48 = DWARFUnit::getUnitDIE(&this->super_DWARFUnit,false);
  if (local_48._8_8_ == (DWARFDebugInfoEntry *)0x0 || local_48 == (DWARFUnit *)0x0) {
    raw_ostream::operator<<(OS,"<compile unit can\'t be parsed!>\n\n");
  }
  else {
    DWARFDie::dump((DWARFDie *)local_48,OS,0,DumpOpts);
  }
  return;
}

Assistant:

void DWARFCompileUnit::dump(raw_ostream &OS, DIDumpOptions DumpOpts) {
  OS << format("0x%08" PRIx64, getOffset()) << ": Compile Unit:"
     << " length = " << format("0x%08" PRIx64, getLength())
     << " version = " << format("0x%04x", getVersion());
  if (getVersion() >= 5)
    OS << " unit_type = " << dwarf::UnitTypeString(getUnitType());
  if (auto* Abbreviations = getAbbreviations()) { // XXX BINARYEN
    OS << " abbr_offset = "
       << format("0x%04" PRIx64, Abbreviations->getOffset());
  }
  OS << " addr_size = " << format("0x%02x", getAddressByteSize());
  if (getVersion() >= 5 && getUnitType() != dwarf::DW_UT_compile)
    OS << " DWO_id = " << format("0x%016" PRIx64, *getDWOId());
  OS << " (next unit at " << format("0x%08" PRIx64, getNextUnitOffset())
     << ")\n";

  if (DWARFDie CUDie = getUnitDIE(false))
    CUDie.dump(OS, 0, DumpOpts);
  else
    OS << "<compile unit can't be parsed!>\n\n";
}